

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall intel_acbp_v2_t::signature_t::_read(signature_t *this)

{
  kstream *this_00;
  uint8_t uVar1;
  uint16_t uVar2;
  string local_30;
  signature_t *local_10;
  signature_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_size_bits = uVar2;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_hash_algorithm_id = uVar2;
  this_00 = (this->super_kstruct).m__io;
  uVar2 = size_bits(this);
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,this_00,(long)(int)(uVar2 / 8));
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void intel_acbp_v2_t::signature_t::_read() {
    m_version = m__io->read_u1();
    m_size_bits = m__io->read_u2le();
    m_hash_algorithm_id = m__io->read_u2le();
    m_signature = m__io->read_bytes((size_bits() / 8));
}